

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodegenerator.cpp
# Opt level: O0

ByteCodeGenerator * __thiscall
stackjit::ByteCodeGenerator::escapedString(ByteCodeGenerator *this,string *str)

{
  bool bVar1;
  reference pcVar2;
  string local_90 [39];
  char local_69;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_68;
  char c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  allocator local_39;
  string local_38 [8];
  string res;
  string *str_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_68._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff98);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    local_69 = *pcVar2;
    if ((local_69 == '\"') || (local_69 == '\\')) {
      std::__cxx11::string::operator+=(local_38,"\\");
    }
    std::__cxx11::string::operator+=(local_38,local_69);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::operator+((char *)local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\"");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_90);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

std::string ByteCodeGenerator::escapedString(std::string str) {
		std::string res = "";

		for (char c : str) {
			if (c == '"' || c == '\\') {
				res += "\\";
			}

			res += c;
		}

		return "\"" + res + "\"";
	}